

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

int __thiscall GrcSymbolTableEntry::FieldIndex(GrcSymbolTableEntry *this,string *sta)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Symbol psymCurr;
  int cRet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  int local_14;
  
  local_14 = -1;
  for (local_20 = in_RDI;
      local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 **(long **)(local_20 + 0x28)) {
    _Var1 = std::operator==(unaff_retaddr,in_RDI);
    if (_Var1) {
      local_14 = Level((GrcSymbolTableEntry *)0x1c608a);
    }
  }
  return local_14;
}

Assistant:

int GrcSymbolTableEntry::FieldIndex(std::string sta)
{
	int cRet = -1;
	Symbol psymCurr = this;
	while (psymCurr)
	{
		if (psymCurr->m_staFieldName == sta)
			cRet = psymCurr->Level();
		psymCurr = psymCurr->m_psymtbl->m_psymParent;
	}
	return cRet;
}